

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::SomeObjectHelper<unsigned_int>
              (RecyclableObject *obj,uint length,uint start,RecyclableObject *callBackFn,Var thisArg
              ,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Var pvVar5;
  JavascriptMethod p_Var6;
  uint64 uVar7;
  uint64 uVar8;
  long lVar9;
  uint32 index;
  ulong uVar10;
  ulong uVar11;
  double value;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,obj);
  lVar9 = 0x3f0;
  if (start < length) {
    jsReentLock._24_8_ = __tls_get_addr(&PTR_01548f08);
    uVar10 = (ulong)start;
    do {
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      index = (uint32)uVar10;
      BVar4 = JavascriptOperators::HasItem(obj,index);
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
      *(bool *)((long)local_80 + 0x108) = true;
      if (BVar4 != 0) {
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar5 = JavascriptOperators::GetItem(obj,index,scriptContext);
        this = scriptContext->threadContext;
        bVar1 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var6 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var6);
        p_Var6 = RecyclableObject::GetEntryPoint(callBackFn);
        if ((int)index < 0) {
          value = (double)(uVar10 & 0xffffffff);
          uVar7 = NumberUtilities::ToSpecial(value);
          bVar3 = NumberUtilities::IsNan(value);
          if (bVar3) {
            uVar8 = NumberUtilities::ToSpecial(value);
            if (uVar8 != 0xfff8000000000000) {
              uVar8 = NumberUtilities::ToSpecial(value);
              if (uVar8 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)jsReentLock._24_8_ = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *(undefined4 *)jsReentLock._24_8_ = 0;
              }
            }
          }
          uVar11 = uVar7 ^ 0xfffc000000000000;
        }
        else {
          uVar11 = uVar10 + 0x1000000000000;
        }
        pvVar5 = (*p_Var6)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,
                           pvVar5,uVar11,obj);
        this->reentrancySafeOrHandled = bVar1;
        BVar4 = JavascriptConversion::ToBoolean(pvVar5,scriptContext);
        if (BVar4 != 0) {
          lVar9 = 1000;
          goto LAB_00baad8e;
        }
      }
      uVar10 = uVar10 + 1;
    } while (length != uVar10);
    lVar9 = 0x3f0;
  }
LAB_00baad8e:
  pvVar5 = *(Var *)((long)&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                           super_JavascriptLibraryBase).super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar9);
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar5;
}

Assistant:

Var JavascriptArray::SomeObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT_UNLOCK(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }

        return scriptContext->GetLibrary()->GetFalse();
    }